

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void grade_source_content_sb
               (AV1_COMP *cpi,MACROBLOCK *x,TileDataEnc *tile_data,int mi_row,int mi_col)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  _Bool calc_src_content;
  AV1_COMMON *cm;
  int in_stack_000000b8;
  int in_stack_000000bc;
  TileDataEnc *in_stack_000000c0;
  MACROBLOCK *in_stack_000000c8;
  AV1_COMP *in_stack_000000d0;
  _Bool local_29;
  
  if (((char)in_RDI[0x77f0] != '\0') &&
     ((*(int *)(*in_RDI + 0xc750) == 0 ||
      (*(int *)(in_RDI[0x13a91] + (long)*(int *)((long)in_RDI + 0x9d334) * 0x3380 + 0x3378) == 0))))
  {
    local_29 = false;
    if ((int)in_RDI[0xc19d] == 0) {
      if ((0 < (int)in_RDI[0xc1b2]) &&
         ((int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc) < 0x18c01)) {
        lVar1 = in_RDI[0xc0f9];
        if (lVar1 == 0) {
          *(undefined4 *)(in_RSI + 0x15d64) = 0;
        }
        local_29 = lVar1 != 0;
      }
    }
    else if (((int)in_RDI[0xc19e] == 0) || (in_RDI[0xc0f9] != 0)) {
      local_29 = is_calc_src_content_needed
                           ((AV1_COMP *)CONCAT44(mi_row,mi_col),(MACROBLOCK *)cm,in_stack_0000000c,
                            in_stack_00000008);
    }
    else {
      *(undefined4 *)(in_RSI + 0x15d60) = 0;
    }
    if (local_29 != false) {
      av1_source_content_sb
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                 in_stack_000000b8);
    }
  }
  return;
}

Assistant:

static inline void grade_source_content_sb(AV1_COMP *cpi, MACROBLOCK *const x,
                                           TileDataEnc *tile_data, int mi_row,
                                           int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  if (cm->current_frame.frame_type == KEY_FRAME ||
      (cpi->ppi->use_svc &&
       cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)) {
    assert(x->content_state_sb.source_sad_nonrd == kMedSad);
    assert(x->content_state_sb.source_sad_rd == kMedSad);
    return;
  }
  bool calc_src_content = false;

  if (cpi->sf.rt_sf.source_metrics_sb_nonrd) {
    if (!cpi->sf.rt_sf.check_scene_detection || cpi->rc.frame_source_sad > 0) {
      calc_src_content = is_calc_src_content_needed(cpi, x, mi_row, mi_col);
    } else {
      x->content_state_sb.source_sad_nonrd = kZeroSad;
    }
  } else if ((cpi->sf.rt_sf.var_part_based_on_qidx >= 1) &&
             (cm->width * cm->height <= 352 * 288)) {
    if (cpi->rc.frame_source_sad > 0)
      calc_src_content = true;
    else
      x->content_state_sb.source_sad_rd = kZeroSad;
  }
  if (calc_src_content)
    av1_source_content_sb(cpi, x, tile_data, mi_row, mi_col);
}